

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O3

void duckdb::MedianAbsoluteDeviationOperation<duckdb::hugeint_t>::
     Finalize<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>>
               (QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *state,
               hugeint_t *target,AggregateFinalizeData *finalize_data)

{
  long lVar1;
  AggregateInputData *this;
  hugeint_t *v_t;
  reference pvVar2;
  idx_t iVar3;
  double dVar4;
  undefined1 auVar5 [16];
  hugeint_t hVar6;
  MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t> accessor;
  hugeint_t med;
  Interpolator<false> interp;
  MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t> local_90;
  double local_88;
  double dStack_80;
  hugeint_t local_70;
  Interpolator<false> local_60;
  
  if ((state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
      super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
      super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pvVar2 = vector<duckdb::QuantileValue,_true>::operator[]
                       ((vector<duckdb::QuantileValue,_true> *)((this->bind_data).ptr + 1),0);
    v_t = (state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
          super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>._M_impl.
          super__Vector_impl_data._M_start;
    iVar3 = (long)(state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
                  super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)v_t >> 4;
    local_60.desc = false;
    lVar1 = iVar3 - 1;
    auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar5._0_8_ = lVar1;
    auVar5._12_4_ = 0x45300000;
    dStack_80 = auVar5._8_8_ - 1.9342813113834067e+25;
    local_88 = (dStack_80 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
               pvVar2->dbl;
    local_60.RN = local_88;
    dVar4 = floor(local_88);
    local_60.FRN = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
    dVar4 = ceil(local_88);
    local_60.CRN = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
    local_60.begin = 0;
    local_60.end = iVar3;
    local_70 = Interpolator<false>::
               Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::QuantileDirect<duckdb::hugeint_t>>
                         (&local_60,v_t,finalize_data->result,
                          (QuantileDirect<duckdb::hugeint_t> *)&local_90);
    local_90.median = &local_70;
    hVar6 = Interpolator<false>::
            Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>>
                      (&local_60,
                       (state->v).
                       super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
                       super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
                       _M_impl.super__Vector_impl_data._M_start,finalize_data->result,&local_90);
    *target = hVar6;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		using INPUT_TYPE = typename STATE::InputType;
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto &q = bind_data.quantiles[0];
		Interpolator<false> interp(q, state.v.size(), false);
		const auto med = interp.template Operation<INPUT_TYPE, MEDIAN_TYPE>(state.v.data(), finalize_data.result);

		MadAccessor<INPUT_TYPE, T, MEDIAN_TYPE> accessor(med);
		target = interp.template Operation<INPUT_TYPE, T>(state.v.data(), finalize_data.result, accessor);
	}